

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha_blocks_ref.c
# Opt level: O1

void hchacha_ref(uint8_t *key,uint8_t *iv,uint8_t *out,size_t rounds)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  
  uVar2 = *(uint *)key;
  uVar6 = *(uint *)(key + 4);
  uVar12 = *(uint *)(key + 8);
  uVar15 = *(uint *)(key + 0xc);
  uVar8 = *(uint *)(key + 0x10);
  uVar13 = *(uint *)(key + 0x14);
  uVar14 = *(uint *)(key + 0x18);
  uVar9 = *(uint *)(key + 0x1c);
  uVar3 = *(uint *)iv;
  uVar1 = *(uint *)(iv + 4);
  uVar5 = *(uint *)(iv + 8);
  local_54 = *(uint *)(iv + 0xc);
  local_58 = 0x61707865;
  local_50 = 0x3320646e;
  local_4c = 0x79622d32;
  local_48 = 0x6b206574;
  do {
    uVar3 = uVar3 ^ local_58 + uVar2;
    uVar3 = uVar3 << 0x10 | uVar3 >> 0x10;
    uVar8 = uVar8 + uVar3;
    uVar10 = uVar2 ^ uVar8;
    uVar10 = uVar10 << 0xc | uVar10 >> 0x14;
    local_58 = local_58 + uVar2 + uVar10;
    uVar3 = uVar3 ^ local_58;
    uVar3 = uVar3 << 8 | uVar3 >> 0x18;
    uVar8 = uVar8 + uVar3;
    uVar10 = uVar10 ^ uVar8;
    uVar11 = uVar10 << 7 | uVar10 >> 0x19;
    uVar1 = uVar1 ^ local_50 + uVar6;
    uVar2 = uVar1 << 0x10 | uVar1 >> 0x10;
    uVar13 = uVar13 + uVar2;
    uVar1 = uVar6 ^ uVar13;
    uVar1 = uVar1 << 0xc | uVar1 >> 0x14;
    local_50 = local_50 + uVar6 + uVar1;
    uVar2 = uVar2 ^ local_50;
    uVar2 = uVar2 << 8 | uVar2 >> 0x18;
    uVar13 = uVar13 + uVar2;
    uVar1 = uVar1 ^ uVar13;
    uVar1 = uVar1 << 7 | uVar1 >> 0x19;
    uVar5 = uVar5 ^ local_4c + uVar12;
    uVar6 = uVar5 << 0x10 | uVar5 >> 0x10;
    uVar14 = uVar14 + uVar6;
    uVar5 = uVar12 ^ uVar14;
    uVar10 = uVar5 << 0xc | uVar5 >> 0x14;
    local_4c = local_4c + uVar12 + uVar10;
    uVar6 = uVar6 ^ local_4c;
    uVar5 = uVar6 << 8 | uVar6 >> 0x18;
    uVar14 = uVar14 + uVar5;
    uVar10 = uVar10 ^ uVar14;
    uVar12 = uVar10 << 7 | uVar10 >> 0x19;
    local_54 = local_54 ^ local_48 + uVar15;
    uVar10 = local_54 << 0x10 | local_54 >> 0x10;
    uVar9 = uVar9 + uVar10;
    uVar6 = uVar15 ^ uVar9;
    uVar6 = uVar6 << 0xc | uVar6 >> 0x14;
    local_48 = local_48 + uVar15 + uVar6;
    uVar10 = uVar10 ^ local_48;
    uVar10 = uVar10 << 8 | uVar10 >> 0x18;
    uVar9 = uVar9 + uVar10;
    uVar6 = uVar6 ^ uVar9;
    uVar15 = uVar6 << 7 | uVar6 >> 0x19;
    local_58 = local_58 + uVar1;
    uVar10 = uVar10 ^ local_58;
    uVar16 = uVar10 << 0x10 | uVar10 >> 0x10;
    uVar14 = uVar14 + uVar16;
    uVar1 = uVar1 ^ uVar14;
    uVar6 = uVar1 << 0xc | uVar1 >> 0x14;
    local_58 = local_58 + uVar6;
    uVar16 = uVar16 ^ local_58;
    local_54 = uVar16 << 8 | uVar16 >> 0x18;
    uVar14 = uVar14 + local_54;
    uVar6 = uVar6 ^ uVar14;
    uVar6 = uVar6 << 7 | uVar6 >> 0x19;
    local_50 = local_50 + uVar12;
    uVar3 = uVar3 ^ local_50;
    uVar4 = uVar3 << 0x10 | uVar3 >> 0x10;
    uVar9 = uVar9 + uVar4;
    uVar12 = uVar12 ^ uVar9;
    uVar12 = uVar12 << 0xc | uVar12 >> 0x14;
    local_50 = local_50 + uVar12;
    uVar4 = uVar4 ^ local_50;
    uVar3 = uVar4 << 8 | uVar4 >> 0x18;
    uVar9 = uVar9 + uVar3;
    uVar12 = uVar12 ^ uVar9;
    uVar12 = uVar12 << 7 | uVar12 >> 0x19;
    local_4c = local_4c + uVar15;
    uVar2 = uVar2 ^ local_4c;
    uVar10 = uVar2 << 0x10 | uVar2 >> 0x10;
    uVar8 = uVar8 + uVar10;
    uVar15 = uVar15 ^ uVar8;
    uVar2 = uVar15 << 0xc | uVar15 >> 0x14;
    local_4c = local_4c + uVar2;
    uVar10 = uVar10 ^ local_4c;
    uVar1 = uVar10 << 8 | uVar10 >> 0x18;
    uVar8 = uVar8 + uVar1;
    uVar2 = uVar2 ^ uVar8;
    uVar15 = uVar2 << 7 | uVar2 >> 0x19;
    local_48 = local_48 + uVar11;
    uVar5 = uVar5 ^ local_48;
    uVar7 = uVar5 << 0x10 | uVar5 >> 0x10;
    uVar13 = uVar13 + uVar7;
    uVar11 = uVar11 ^ uVar13;
    uVar2 = uVar11 << 0xc | uVar11 >> 0x14;
    local_48 = local_48 + uVar2;
    uVar7 = uVar7 ^ local_48;
    uVar5 = uVar7 << 8 | uVar7 >> 0x18;
    uVar13 = uVar13 + uVar5;
    uVar2 = uVar2 ^ uVar13;
    uVar2 = uVar2 << 7 | uVar2 >> 0x19;
    rounds = rounds - 2;
  } while (rounds != 0);
  *out = (uint8_t)local_58;
  out[1] = (uint8_t)(local_58 >> 8);
  out[2] = (uint8_t)(local_58 >> 0x10);
  out[3] = (uint8_t)(local_58 >> 0x18);
  out[4] = (uint8_t)local_50;
  out[5] = (uint8_t)(local_50 >> 8);
  out[6] = (uint8_t)(local_50 >> 0x10);
  out[7] = (uint8_t)(local_50 >> 0x18);
  out[8] = (uint8_t)local_4c;
  out[9] = (uint8_t)(local_4c >> 8);
  out[10] = (uint8_t)(local_4c >> 0x10);
  out[0xb] = (uint8_t)(local_4c >> 0x18);
  out[0xc] = (uint8_t)local_48;
  out[0xd] = (uint8_t)(local_48 >> 8);
  out[0xe] = (uint8_t)(local_48 >> 0x10);
  out[0xf] = (uint8_t)(local_48 >> 0x18);
  out[0x10] = (uint8_t)(uVar4 >> 0x18);
  out[0x11] = (uint8_t)uVar4;
  out[0x12] = (uint8_t)(uVar4 >> 8);
  out[0x13] = (uint8_t)(uVar4 >> 0x10);
  out[0x14] = (uint8_t)(uVar10 >> 0x18);
  out[0x15] = (uint8_t)uVar10;
  out[0x16] = (uint8_t)(uVar10 >> 8);
  out[0x17] = (uint8_t)(uVar10 >> 0x10);
  out[0x18] = (uint8_t)(uVar7 >> 0x18);
  out[0x19] = (uint8_t)uVar7;
  out[0x1a] = (uint8_t)(uVar7 >> 8);
  out[0x1b] = (uint8_t)(uVar7 >> 0x10);
  out[0x1c] = (uint8_t)(uVar16 >> 0x18);
  out[0x1d] = (uint8_t)uVar16;
  out[0x1e] = (uint8_t)(uVar16 >> 8);
  out[0x1f] = (uint8_t)(uVar16 >> 0x10);
  return;
}

Assistant:

void
hchacha_ref(const uint8_t key[32], const uint8_t iv[16], uint8_t out[32], size_t rounds) {
    uint32_t x[16];
    uint32_t t;

    x[0] = chacha_constants[0];
    x[1] = chacha_constants[1];
    x[2] = chacha_constants[2];
    x[3] = chacha_constants[3];
    x[4] = U8TO32(key + 0);
    x[5] = U8TO32(key + 4);
    x[6] = U8TO32(key + 8);
    x[7] = U8TO32(key + 12);
    x[8] = U8TO32(key + 16);
    x[9] = U8TO32(key + 20);
    x[10] = U8TO32(key + 24);
    x[11] = U8TO32(key + 28);
    x[12] = U8TO32(iv + 0);
    x[13] = U8TO32(iv + 4);
    x[14] = U8TO32(iv + 8);
    x[15] = U8TO32(iv + 12);

    do {
        doubleround()
        rounds -= 2;
    } while (rounds);

    /* indices for the chacha constant */
    U32TO8(out + 0, x[0]);
    U32TO8(out + 4, x[1]);
    U32TO8(out + 8, x[2]);
    U32TO8(out + 12, x[3]);

    /* indices for the iv */
    U32TO8(out + 16, x[12]);
    U32TO8(out + 20, x[13]);
    U32TO8(out + 24, x[14]);
    U32TO8(out + 28, x[15]);
}